

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

string * __thiscall
chaiscript::eval::Logical_And_AST_Node::pretty_print_abi_cxx11_(Logical_And_AST_Node *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  AST_Node *in_stack_00000168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [48];
  
  __lhs = &local_50;
  AST_Node::pretty_print_abi_cxx11_(in_stack_00000168);
  std::operator+((char *)__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return in_RDI;
}

Assistant:

virtual std::string pretty_print() const CHAISCRIPT_OVERRIDE
        {
          return "(" + AST_Node::pretty_print() + ")";
        }